

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadPool.c
# Opt level: O2

int create_tpool(tpool_t **pool,size_t max_thread_num)

{
  int iVar1;
  tpool_t *ptVar2;
  pthread_t *ppVar3;
  uint *puVar4;
  char *pcVar5;
  uint __errnum;
  long lVar6;
  long lVar7;
  char *__format;
  
  ptVar2 = (tpool_t *)malloc(0x78);
  *pool = ptVar2;
  if (ptVar2 == (tpool_t *)0x0) {
    puVar4 = (uint *)__errno_location();
    __errnum = *puVar4;
    pcVar5 = strerror(__errnum);
    __format = "in %s,malloc tpool_t failed!,errno = %d,explain:%s\n";
  }
  else {
    ptVar2->shutdown = 0;
    ptVar2->maxnum_thread = max_thread_num;
    ppVar3 = (pthread_t *)malloc(max_thread_num * 8);
    ptVar2->thread_id = ppVar3;
    if (ppVar3 == (pthread_t *)0x0) {
      puVar4 = (uint *)__errno_location();
      __errnum = *puVar4;
      pcVar5 = strerror(__errnum);
      __format = "in %s,init thread id failed,errno = %d,explain:%s";
    }
    else {
      ptVar2->tpool_head = (tpool_work_t *)0x0;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&ptVar2->queue_lock,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_cond_init((pthread_cond_t *)&(*pool)->queue_ready,(pthread_condattr_t *)0x0)
        ;
        if (iVar1 == 0) {
          lVar6 = max_thread_num + 1;
          lVar7 = 0;
          do {
            lVar6 = lVar6 + -1;
            if (lVar6 == 0) {
              return 0;
            }
            iVar1 = pthread_create((pthread_t *)(lVar7 + (long)(*pool)->thread_id),
                                   (pthread_attr_t *)0x0,work_routine,*pool);
            lVar7 = lVar7 + 8;
          } while (iVar1 == 0);
          puts("pthread_create failed!");
          goto LAB_00105a1d;
        }
        puVar4 = (uint *)__errno_location();
        __errnum = *puVar4;
        pcVar5 = strerror(__errnum);
        __format = "in %s,initial condition variable failed,errno = %d,explain:%s";
      }
      else {
        puVar4 = (uint *)__errno_location();
        __errnum = *puVar4;
        pcVar5 = strerror(__errnum);
        __format = "in %s,initial mutex failed,errno = %d,explain:%s";
      }
    }
  }
  printf(__format,"create_tpool",(ulong)__errnum,pcVar5);
LAB_00105a1d:
  exit(-1);
}

Assistant:

int create_tpool(tpool_t** pool,size_t max_thread_num)
{
   (*pool) = (tpool_t*)malloc(sizeof(tpool_t));
   if(NULL == *pool){
        printf("in %s,malloc tpool_t failed!,errno = %d,explain:%s\n",__func__,errno,strerror(errno));
        exit(-1);
   }
   (*pool)->shutdown = 0;
   (*pool)->maxnum_thread = max_thread_num;
   (*pool)->thread_id = (pthread_t*)malloc(sizeof(pthread_t)*max_thread_num);
   if((*pool)->thread_id == NULL){
        printf("in %s,init thread id failed,errno = %d,explain:%s",__func__,errno,strerror(errno));
        exit(-1);
   }
   (*pool)->tpool_head = NULL;
   if(pthread_mutex_init(&((*pool)->queue_lock),NULL) != 0){
        printf("in %s,initial mutex failed,errno = %d,explain:%s",__func__,errno,strerror(errno));
        exit(-1);
   }
 
   if(pthread_cond_init(&((*pool)->queue_ready),NULL) != 0){
        printf("in %s,initial condition variable failed,errno = %d,explain:%s",__func__,errno,strerror(errno));
        exit(-1);
   }
 
   for(int i = 0; i < max_thread_num; i++){
        if(pthread_create(&((*pool)->thread_id[i]),NULL,work_routine,(void*)(*pool)) != 0){
           printf("pthread_create failed!\n");
           exit(-1);
        }
   }
return 0;
}